

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

int Abc_NtkFinRefinement
              (Abc_Ntk_t *pNtk,Vec_Int_t *vTypes,Vec_Int_t *vCos,Vec_Int_t *vCis,Vec_Int_t *vNodes,
              Vec_Int_t *vPairs,Vec_Int_t *vList,Vec_Wec_t *vMap2,Vec_Wec_t *vResult)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Wec_t *p;
  Vec_Wrd_t *vSims_00;
  Vec_Int_t *vLits_00;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *vNewClass;
  int Types [2];
  int Objs [2];
  int iFin0;
  int nCalls;
  int Index;
  int iFin;
  int k;
  int i;
  Vec_Int_t *vArray;
  Vec_Int_t *vClass;
  Vec_Int_t *vPat;
  Vec_Int_t *vLits;
  Vec_Wrd_t *vSims;
  int nWords;
  Vec_Wec_t *vRes;
  Vec_Int_t *vPairs_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vCis_local;
  Vec_Int_t *vCos_local;
  Vec_Int_t *vTypes_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_WecAlloc(100);
  iVar1 = Vec_IntSize(vList);
  iVar1 = Abc_Bit6WordNum(iVar1);
  iVar2 = Abc_NtkObjNumMax(pNtk);
  vSims_00 = Vec_WrdStart(iVar1 * iVar2);
  iVar2 = Abc_NtkObjNumMax(pNtk);
  vLits_00 = Vec_IntStart(iVar2 << 1);
  Objs[1] = 0;
  pVVar6 = Vec_WecPushLevel(p);
  Abc_NtkFinLocalSetup(vPairs,vList,vMap2,pVVar6);
  for (iFin = 0; iFin < 2; iFin = iFin + 1) {
    iVar2 = Vec_IntSize(vCis);
    pVVar6 = Vec_IntAlloc(iVar2);
    iVar2 = Vec_IntSize(vCis);
    Vec_IntFill(pVVar6,iVar2,iFin);
    Abc_NtkFinSimulateOne(pNtk,vTypes,vCos,vCis,vNodes,vMap2,pVVar6,vSims_00,iVar1,vPairs,p,0,1);
    Vec_IntFree(pVVar6);
  }
  iFin = 0;
  do {
    iVar2 = Vec_WecSize(p);
    if (iVar2 <= iFin) {
      Abc_NtkFinLocalSetdown(vPairs,vList,vMap2);
      iFin = 0;
      while( true ) {
        iVar1 = Vec_WecSize(p);
        if (iVar1 <= iFin) {
          Vec_WecFree(p);
          Vec_WrdFree(vSims_00);
          Vec_IntFree(vLits_00);
          return Objs[1];
        }
        pVVar6 = Vec_WecEntry(p,iFin);
        iVar1 = Vec_IntSize(pVVar6);
        if (iVar1 % 2 != 0) break;
        iVar1 = Vec_IntSize(pVVar6);
        if (2 < iVar1) {
          pVVar7 = Vec_WecPushLevel(vResult);
          for (Index = 0; iVar1 = Vec_IntSize(pVVar6), Index + 1 < iVar1; Index = Index + 2) {
            iVar1 = Vec_IntEntry(pVVar6,Index);
            Vec_IntEntry(pVVar6,Index + 1);
            Vec_IntPush(pVVar7,iVar1);
          }
        }
        iFin = iFin + 1;
      }
      __assert_fail("Vec_IntSize(vArray) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                    ,0x404,
                    "int Abc_NtkFinRefinement(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *)"
                   );
    }
    vArray = Vec_WecEntry(p,iFin);
    iVar2 = Vec_IntEntry(vArray,0);
    for (Index = 2; iVar3 = Vec_IntSize(vArray), Index + 1 < iVar3; Index = Index + 2) {
      iVar3 = Vec_IntEntry(vArray,Index);
      iVar5 = Vec_IntEntry(vArray,Index + 1);
      Types[0] = Vec_IntEntry(vPairs,iVar2 << 1);
      Types[1] = Vec_IntEntry(vPairs,iVar3 << 1);
      vNewClass._0_4_ = Vec_IntEntry(vPairs,iVar2 * 2 + 1);
      vNewClass._4_4_ = Vec_IntEntry(vPairs,iVar3 * 2 + 1);
      Objs[1] = Objs[1] + 1;
      pVVar6 = Abc_NtkFinCheckPair(pNtk,vTypes,vCos,vCis,vNodes,Types,(int *)&vNewClass,vLits_00);
      if (pVVar6 != (Vec_Int_t *)0x0) {
        iVar4 = Vec_IntEntry(vArray,Index);
        if (iVar4 != iVar3) {
          __assert_fail("Vec_IntEntry(vClass, k) == iFin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                        ,0x3ec,
                        "int Abc_NtkFinRefinement(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *)"
                       );
        }
        iVar4 = Vec_IntSize(pVVar6);
        if (iVar4 == 0) {
          pVVar7 = Vec_WecPushLevel(p);
          Vec_IntPushTwo(pVVar7,iVar3,iVar5);
          pVVar7 = Vec_WecEntry(p,iFin);
          Vec_IntDrop(pVVar7,Index + 1);
          Vec_IntDrop(pVVar7,Index);
        }
        else {
          Abc_NtkFinSimulateOne
                    (pNtk,vTypes,vCos,vCis,vNodes,vMap2,pVVar6,vSims_00,iVar1,vPairs,p,iFin,
                     Index / 2);
        }
        Vec_IntFree(pVVar6);
        vArray = Vec_WecEntry(p,iFin);
        iVar5 = Vec_IntSize(vArray);
        if ((Index < iVar5) && (iVar5 = Vec_IntEntry(vArray,Index), iVar5 == iVar3)) {
          __assert_fail("Vec_IntSize(vClass) <= k || Vec_IntEntry(vClass, k) != iFin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                        ,0x3fa,
                        "int Abc_NtkFinRefinement(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *)"
                       );
        }
        Index = Index + -2;
      }
    }
    iFin = iFin + 1;
  } while( true );
}

Assistant:

int Abc_NtkFinRefinement( Abc_Ntk_t * pNtk, Vec_Int_t * vTypes, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes, 
                          Vec_Int_t * vPairs, Vec_Int_t * vList, Vec_Wec_t * vMap2, Vec_Wec_t * vResult )
{
    Vec_Wec_t * vRes  = Vec_WecAlloc( 100 );
    int nWords = Abc_Bit6WordNum( Vec_IntSize(vList) );
    Vec_Wrd_t * vSims = Vec_WrdStart( nWords * Abc_NtkObjNumMax(pNtk) );  // simulation info for each object
    Vec_Int_t * vLits = Vec_IntStart( 2*Abc_NtkObjNumMax(pNtk) );         // two literals for each object
    Vec_Int_t * vPat, * vClass, * vArray;  
    int i, k, iFin, Index, nCalls = 0;
    // prepare
    vArray = Vec_WecPushLevel( vRes );
    Abc_NtkFinLocalSetup( vPairs, vList, vMap2, vArray );
    // try all-0/all-1 pattern
    for ( i = 0; i < 2; i++ )
    {
        vPat = Vec_IntAlloc( Vec_IntSize(vCis) );
        Vec_IntFill( vPat, Vec_IntSize(vCis), i );
        Abc_NtkFinSimulateOne( pNtk, vTypes, vCos, vCis, vNodes, vMap2, vPat, vSims, nWords, vPairs, vRes, 0, 1 );
        Vec_IntFree( vPat );
    }
    // explore the classes
    //Vec_WecPrint( vRes, 0 );
    Vec_WecForEachLevel( vRes, vClass, i )
    {
        int iFin0  = Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntryDoubleStart( vClass, iFin, Index, k, 2 )
        {
            int Objs[2]  = { Vec_IntEntry(vPairs, 2*iFin0),   Vec_IntEntry(vPairs, 2*iFin)   }; 
            int Types[2] = { Vec_IntEntry(vPairs, 2*iFin0+1), Vec_IntEntry(vPairs, 2*iFin+1) }; 
            nCalls++;
            //printf( "Checking pair %d and %d.\n", iFin0, iFin );
            vPat = Abc_NtkFinCheckPair( pNtk, vTypes, vCos, vCis, vNodes, Objs, Types, vLits );
            if ( vPat == NULL ) // proved
                continue;
            assert( Vec_IntEntry(vClass, k) == iFin );
            if ( Vec_IntSize(vPat) == 0 )
            {
                Vec_Int_t * vNewClass = Vec_WecPushLevel( vRes );
                Vec_IntPushTwo( vNewClass, iFin, Index );  // index and first entry
                vClass = Vec_WecEntry( vRes, i );
                Vec_IntDrop( vClass, k+1 );
                Vec_IntDrop( vClass, k );
            }
            else // resimulate and refine
                Abc_NtkFinSimulateOne( pNtk, vTypes, vCos, vCis, vNodes, vMap2, vPat, vSims, nWords, vPairs, vRes, i, k/2 );
            Vec_IntFree( vPat );
            // make sure refinement happened (k'th entry is now absent or different)
            vClass = Vec_WecEntry( vRes, i );
            assert( Vec_IntSize(vClass) <= k || Vec_IntEntry(vClass, k) != iFin );
            k -= 2;
            //Vec_WecPrint( vRes, 0 );
        }
    }
    // unprepare
    Abc_NtkFinLocalSetdown( vPairs, vList, vMap2 );
    // reload proved equivs into the final array
    Vec_WecForEachLevel( vRes, vArray, i )
    {
        assert( Vec_IntSize(vArray) % 2 == 0 );
        if ( Vec_IntSize(vArray) <= 2 )
            continue;
        vClass = Vec_WecPushLevel( vResult );
        Vec_IntForEachEntryDouble( vArray, iFin, Index, k )
            Vec_IntPush( vClass, iFin );
    }
    Vec_WecFree( vRes );
    Vec_WrdFree( vSims );
    Vec_IntFree( vLits );
    return nCalls;
}